

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

void cuddCacheFlush(DdManager *table)

{
  uint uVar1;
  DdCache *pDVar2;
  DdCache *cache;
  int slots;
  int i;
  DdManager *table_local;
  
  uVar1 = table->cacheSlots;
  pDVar2 = table->cache;
  for (cache._4_4_ = 0; cache._4_4_ < (int)uVar1; cache._4_4_ = cache._4_4_ + 1) {
    table->cachedeletions =
         (double)(pDVar2[cache._4_4_].data != (DdNode *)0x0) + table->cachedeletions;
    pDVar2[cache._4_4_].data = (DdNode *)0x0;
  }
  table->cacheLastInserts = table->cacheinserts;
  return;
}

Assistant:

void
cuddCacheFlush(
  DdManager * table)
{
    int i, slots;
    DdCache *cache;

    slots = table->cacheSlots;
    cache = table->cache;
    for (i = 0; i < slots; i++) {
        table->cachedeletions += cache[i].data != NULL;
        cache[i].data = NULL;
    }
    table->cacheLastInserts = table->cacheinserts;

    return;

}